

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O0

char * __thiscall ExportEntryWrapper::getFuncName(ExportEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  char *name;
  uint64_t funcRva;
  ExportEntryWrapper *this_local;
  
  oVar3 = getFuncNameRva(this);
  if (oVar3 == 0xffffffffffffffff) {
    this_local = (ExportEntryWrapper *)0x0;
  }
  else {
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar3,2,1,0);
    this_local = (ExportEntryWrapper *)CONCAT44(extraout_var,iVar2);
    if (this_local == (ExportEntryWrapper *)0x0) {
      this_local = (ExportEntryWrapper *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char* ExportEntryWrapper::getFuncName()
{
    uint64_t funcRva = getFuncNameRva();
    if (funcRva == INVALID_ADDR) return NULL;

    char* name = (char*) this->m_Exe->getContentAt(funcRva, Executable::RVA, 1);
    if (name == NULL) return NULL;
    //TODO.... verify
    return name;
}